

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smodels.cpp
# Opt level: O1

Id_t __thiscall Potassco::SmodelsInput::NodeTab::add(NodeTab *this,StringSpan *n)

{
  Id_t IVar1;
  __hashtable *__h;
  pair<std::__detail::_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_false,_true>,_bool>
  pVar2;
  uint *local_68;
  undefined8 local_60;
  uint local_58 [2];
  undefined4 uStack_50;
  undefined4 uStack_4c;
  uint *local_48;
  undefined8 local_40;
  uint local_38 [2];
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined4 local_28;
  
  local_68 = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,n->first,n->first + n->size);
  local_28 = (undefined4)(this->nodes)._M_h._M_element_count;
  if (local_68 == local_58) {
    uStack_30 = uStack_50;
    uStack_2c = uStack_4c;
    local_48 = local_38;
  }
  else {
    local_48 = local_68;
  }
  local_40 = local_60;
  local_60 = 0;
  local_58[0] = local_58[0] & 0xffffff00;
  local_68 = local_58;
  pVar2 = std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::_M_emplace<std::pair<std::__cxx11::string_const,unsigned_int>>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)this);
  IVar1 = *(Id_t *)((long)pVar2.first.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                          ._M_cur.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                   + 0x28);
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  return IVar1;
}

Assistant:

Id_t add(const StringSpan& n) {
		return nodes.insert(StrMap::value_type(std::string(begin(n), end(n)), (Id_t)nodes.size())).first->second;
	}